

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O0

QString * __thiscall
QHttpNetworkConnectionPrivate::errorDetail
          (QHttpNetworkConnectionPrivate *this,NetworkError errorCode,QIODevice *socket,
          QString *extraDetail)

{
  QStringBuilder<QLatin1String,_QString> *in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  QLatin1String *in_RDI;
  QString *in_R8;
  long in_FS_OFFSET;
  QString *errorString;
  QString peerName;
  QIODevice *in_stack_fffffffffffffe18;
  QLatin1String *a;
  int fieldWidth;
  uint3 in_stack_fffffffffffffe3c;
  uint uVar1;
  undefined4 in_stack_fffffffffffffe50;
  char local_198 [6];
  QChar in_stack_fffffffffffffe6e;
  char local_180 [48];
  QLatin1StringView local_150;
  char local_118 [24];
  char local_100 [24];
  char local_e8 [24];
  char local_d0 [24];
  char local_b8 [24];
  char local_a0 [24];
  char local_88 [24];
  char local_70 [30];
  QChar local_52;
  char local_50 [48];
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  fieldWidth = (int)((ulong)in_RSI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (uint)in_stack_fffffffffffffe3c;
  in_RDI[1].m_size = -0x5555555555555556;
  ((DataPointer *)&in_RDI->m_size)->d = (Data *)0xaaaaaaaaaaaaaaaa;
  in_RDI->m_data = (char *)0xaaaaaaaaaaaaaaaa;
  a = in_RDI;
  QString::QString((QString *)0x2eb73d);
  if (in_EDX == 1) {
    QCoreApplication::translate(local_70,"QHttp","Connection refused",0);
    QString::operator=((QString *)in_RDI,(QString *)in_stack_fffffffffffffe18);
    QString::~QString((QString *)0x2eb932);
  }
  else if (in_EDX == 2) {
    QCoreApplication::translate(local_88,"QHttp","Connection closed",0);
    QString::operator=((QString *)in_RDI,(QString *)in_stack_fffffffffffffe18);
    QString::~QString((QString *)0x2eb97b);
  }
  else if (in_EDX == 3) {
    local_20 = 0xaaaaaaaaaaaaaaaa;
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    if (in_RCX == (QStringBuilder<QLatin1String,_QString> *)0x0) {
      QString::QString((QString *)in_RDI,(QString *)in_stack_fffffffffffffe18);
    }
    else {
      QSocketAbstraction::socketPeerName(in_stack_fffffffffffffe18);
    }
    QCoreApplication::translate(local_50,"QHttp","Host %1 not found",0);
    QChar::QChar<char16_t,_true>(&local_52,L' ');
    QString::arg<QString,_true>
              (in_R8,(QString *)CONCAT44(uVar1,in_EDX),fieldWidth,in_stack_fffffffffffffe6e);
    QString::operator=((QString *)in_RDI,(QString *)in_stack_fffffffffffffe18);
    QString::~QString((QString *)0x2eb8cf);
    QString::~QString((QString *)0x2eb8dc);
    QString::~QString((QString *)0x2eb8e9);
  }
  else if (in_EDX == 4) {
    QCoreApplication::translate(local_a0,"QAbstractSocket","Socket operation timed out",0);
    QString::operator=((QString *)in_RDI,(QString *)in_stack_fffffffffffffe18);
    QString::~QString((QString *)0x2eb9c4);
  }
  else if (in_EDX == 6) {
    QCoreApplication::translate(local_118,"QHttp","SSL handshake failed",0);
    QString::operator=((QString *)in_RDI,(QString *)in_stack_fffffffffffffe18);
    QString::~QString((QString *)0x2ebb31);
    if (in_RCX != (QStringBuilder<QLatin1String,_QString> *)0x0) {
      local_150 = Qt::Literals::StringLiterals::operator____L1((char *)a,(size_t)in_RDI);
      QIODevice::errorString();
      ::operator+(a,(QString *)in_RDI);
      ::operator+=((QString *)CONCAT44(in_EDX,in_stack_fffffffffffffe50),in_RCX);
      QStringBuilder<QLatin1String,_QString>::~QStringBuilder
                ((QStringBuilder<QLatin1String,_QString> *)0x2ebba8);
      QString::~QString((QString *)0x2ebbb5);
    }
  }
  else if (in_EDX == 10) {
    QCoreApplication::translate(local_180,"QHttp","Too many redirects",0);
    QString::operator=((QString *)in_RDI,(QString *)in_stack_fffffffffffffe18);
    QString::~QString((QString *)0x2ebbf5);
  }
  else if (in_EDX == 0xb) {
    QCoreApplication::translate(local_198,"QHttp","Insecure redirect",0);
    QString::operator=((QString *)in_RDI,(QString *)in_stack_fffffffffffffe18);
    QString::~QString((QString *)0x2ebc32);
  }
  else if (in_EDX == 0x69) {
    QCoreApplication::translate(local_b8,"QHttp","Proxy requires authentication",0);
    QString::operator=((QString *)in_RDI,(QString *)in_stack_fffffffffffffe18);
    QString::~QString((QString *)0x2eba0d);
  }
  else if (in_EDX == 0xcc) {
    QCoreApplication::translate(local_d0,"QHttp","Host requires authentication",0);
    QString::operator=((QString *)in_RDI,(QString *)in_stack_fffffffffffffe18);
    QString::~QString((QString *)0x2eba56);
  }
  else if (in_EDX == 0x12d) {
    QCoreApplication::translate(local_100,"QHttp","Unknown protocol specified",0);
    QString::operator=((QString *)in_RDI,(QString *)in_stack_fffffffffffffe18);
    QString::~QString((QString *)0x2ebae8);
  }
  else if (in_EDX == 399) {
    QCoreApplication::translate(local_e8,"QHttp","Data corrupted",0);
    QString::operator=((QString *)in_RDI,(QString *)in_stack_fffffffffffffe18);
    QString::~QString((QString *)0x2eba9f);
  }
  else {
    QString::operator=((QString *)in_RDI,(QString *)in_R8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)a;
  }
  __stack_chk_fail();
}

Assistant:

QString QHttpNetworkConnectionPrivate::errorDetail(QNetworkReply::NetworkError errorCode, QIODevice *socket, const QString &extraDetail)
{
    QString errorString;
    switch (errorCode) {
    case QNetworkReply::HostNotFoundError: {
        const QString peerName = socket ? QSocketAbstraction::socketPeerName(socket) : hostName;
        errorString = QCoreApplication::translate("QHttp", "Host %1 not found").arg(peerName);
        break;
    }
    case QNetworkReply::ConnectionRefusedError:
        errorString = QCoreApplication::translate("QHttp", "Connection refused");
        break;
    case QNetworkReply::RemoteHostClosedError:
        errorString = QCoreApplication::translate("QHttp", "Connection closed");
        break;
    case QNetworkReply::TimeoutError:
        errorString = QCoreApplication::translate("QAbstractSocket", "Socket operation timed out");
        break;
    case QNetworkReply::ProxyAuthenticationRequiredError:
        errorString = QCoreApplication::translate("QHttp", "Proxy requires authentication");
        break;
    case QNetworkReply::AuthenticationRequiredError:
        errorString = QCoreApplication::translate("QHttp", "Host requires authentication");
        break;
    case QNetworkReply::ProtocolFailure:
        errorString = QCoreApplication::translate("QHttp", "Data corrupted");
        break;
    case QNetworkReply::ProtocolUnknownError:
        errorString = QCoreApplication::translate("QHttp", "Unknown protocol specified");
        break;
    case QNetworkReply::SslHandshakeFailedError:
        errorString = QCoreApplication::translate("QHttp", "SSL handshake failed");
        if (socket)
            errorString += ": "_L1 + socket->errorString();
        break;
    case QNetworkReply::TooManyRedirectsError:
        errorString = QCoreApplication::translate("QHttp", "Too many redirects");
        break;
    case QNetworkReply::InsecureRedirectError:
        errorString = QCoreApplication::translate("QHttp", "Insecure redirect");
        break;
    default:
        // all other errors are treated as QNetworkReply::UnknownNetworkError
        errorString = extraDetail;
        break;
    }
    return errorString;
}